

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddTargetDepends
          (cmGlobalGenerator *this,cmGeneratorTarget *target,TargetDependSet *projectTargets)

{
  bool bVar1;
  set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *this_00;
  reference this_01;
  cmGeneratorTarget *target_00;
  pair<std::_Rb_tree_const_iterator<cmTargetDepend>,_bool> pVar2;
  cmTargetDepend *t;
  iterator __end2;
  iterator __begin2;
  TargetDependSet *__range2;
  TargetDependSet *ts;
  cmTargetDepend local_50;
  _Base_ptr local_30;
  undefined1 local_28;
  TargetDependSet *local_20;
  TargetDependSet *projectTargets_local;
  cmGeneratorTarget *target_local;
  cmGlobalGenerator *this_local;
  
  local_20 = projectTargets;
  projectTargets_local = (TargetDependSet *)target;
  target_local = (cmGeneratorTarget *)this;
  cmTargetDepend::cmTargetDepend(&local_50,target);
  pVar2 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
          insert(&projectTargets->
                  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                 ,&local_50);
  local_30 = (_Base_ptr)pVar2.first._M_node;
  local_28 = pVar2.second;
  cmTargetDepend::~cmTargetDepend(&local_50);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    this_00 = &GetTargetDirectDepends(this,(cmGeneratorTarget *)projectTargets_local)->
               super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
    ;
    __end2 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
             begin(this_00);
    t = (cmTargetDepend *)
        std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::end
                  (this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&t), bVar1) {
      this_01 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end2);
      target_00 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(this_01);
      AddTargetDepends(this,target_00,local_20);
      std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddTargetDepends(cmGeneratorTarget const* target,
                                         TargetDependSet& projectTargets)
{
  // add the target itself
  if (projectTargets.insert(target).second) {
    // This is the first time we have encountered the target.
    // Recursively follow its dependencies.
    TargetDependSet const& ts = this->GetTargetDirectDepends(target);
    for (auto const& t : ts) {
      this->AddTargetDepends(t, projectTargets);
    }
  }
}